

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fClippingTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Functional::anon_unknown_0::PolyVertexClipTestGroup::init
          (PolyVertexClipTestGroup *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  Context *pCVar2;
  long *plVar3;
  PolyVertexClipTestGroup *pPVar4;
  int i;
  uint uVar5;
  TestNode *node;
  TestNode *node_00;
  TestNode *node_01;
  long lVar6;
  long *plVar7;
  TriangleCaseBase *pTVar8;
  undefined8 *puVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  long sqSum;
  long *plVar14;
  undefined1 **ppuVar15;
  char *pcVar16;
  long lVar17;
  int i_8;
  int i_9;
  int iVar18;
  ulong uVar19;
  long lVar20;
  bool bVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  Vec3 r2;
  Vector<long,_3> res_2;
  Vector<long,_3> d1;
  Vector<long,_3> d2;
  Vector<long,_3> normalDir;
  Vector<long,_3> res_1;
  TriangleData triangle;
  IVec3 r0;
  Vector<long,_3> res_4;
  IVec3 r2_1;
  IVec3 r1;
  Vector<long,_3> res_3;
  string name;
  Random rnd;
  IVec3 outside [26];
  undefined8 local_448;
  ulong local_440;
  long local_438;
  long lStack_430;
  undefined8 local_428;
  ulong uStack_420;
  long local_418;
  long lStack_410;
  undefined8 local_408;
  ulong local_400;
  long local_3f8;
  long lStack_3f0;
  undefined8 local_3e8;
  ulong local_3e0;
  long local_3d8;
  long lStack_3d0;
  undefined8 local_3c8;
  long local_3c0;
  long local_3b8;
  long lStack_3b0;
  undefined8 local_3a8;
  ulong uStack_3a0;
  long local_398;
  long lStack_390;
  float *local_388;
  float *local_380;
  undefined1 local_378 [16];
  undefined1 *local_368;
  undefined1 *puStack_360;
  float local_358 [4];
  undefined1 *local_348;
  undefined1 *puStack_340;
  float local_338 [4];
  undefined1 *local_328;
  undefined1 *puStack_320;
  float *local_318;
  long local_310;
  undefined8 local_308;
  float local_300;
  long *local_2f8;
  ulong uStack_2f0;
  long local_2e8;
  long lStack_2e0;
  ulong local_2d8;
  ulong local_2d0;
  long *local_2c8;
  undefined8 local_2c0;
  int local_2b8;
  undefined8 local_2b0;
  int local_2a8;
  ulong local_2a0;
  ulong local_298;
  float *local_290;
  long *local_288;
  long lStack_280;
  long local_278;
  long lStack_270;
  long *local_268;
  long local_260;
  long local_258;
  long lStack_250;
  long *local_248;
  long local_240;
  long local_238;
  long lStack_230;
  PolyVertexClipTestGroup *local_228;
  long local_220;
  undefined1 local_218 [24];
  undefined1 *puStack_200;
  float local_1f8 [4];
  undefined1 *local_1e8;
  undefined1 *puStack_1e0;
  float local_1d8 [4];
  undefined1 *local_1c8;
  undefined1 *puStack_1c0;
  TestNode *local_1b8;
  undefined1 *local_1b0;
  ulong local_1a8;
  long *local_1a0 [2];
  long local_190 [2];
  TestNode *local_180;
  deRandom local_178;
  float local_168;
  int iStack_164;
  float fStack_160;
  undefined1 auStack_15c [4];
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined1 *local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  GLint local_a8 [8];
  undefined1 *local_88;
  undefined8 uStack_80;
  undefined1 *local_78;
  undefined8 uStack_70;
  undefined1 *local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_168 = -NAN;
  iStack_164 = 0;
  fStack_160 = 0.0;
  auStack_15c = (undefined1  [4])0x1;
  local_158 = 0;
  uStack_150 = 0x100000000;
  local_148 = 0;
  uStack_140 = 0xffffffff;
  local_138 = 0;
  uStack_130 = 1;
  local_128 = 0xffffffff00000000;
  uStack_120 = 0xffffffffffffffff;
  local_118 = 0x100000000;
  uStack_110 = 0xffffffff;
  local_108 = &DAT_100000001;
  uStack_100 = 0xffffffff00000000;
  local_f8 = 1;
  uStack_f0 = 0xffffffff;
  local_e8 = 0x1ffffffff;
  uStack_e0 = 0xffffffff00000000;
  local_d8 = 1;
  uStack_d0 = 0xffffffff00000001;
  local_c8 = 0x100000000;
  uStack_c0 = 0xffffffff00000000;
  local_b8 = 0xffffffff;
  uStack_b0 = 0xffffffff00000001;
  local_a8[0] = 0;
  local_a8[1] = 1;
  local_a8[2] = 1;
  local_a8[3] = 0;
  local_a8[4] = -1;
  local_a8[5] = 1;
  local_a8[6] = -1;
  local_a8[7] = -1;
  local_88 = &DAT_100000001;
  uStack_80 = 0x1ffffffff;
  local_78 = &DAT_100000001;
  uStack_70 = 0xffffffff00000001;
  local_68 = &DAT_100000001;
  uStack_60 = 0xffffffffffffffff;
  local_58 = 0x1ffffffff;
  uStack_50 = 0xffffffffffffffff;
  local_48 = &DAT_100000001;
  uStack_40 = 0xffffffffffffffff;
  local_38 = 0xffffffff00000001;
  deRandom_init(&local_178,0xabcdef);
  node = (TestNode *)operator_new(0x78);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,pCVar2->m_testCtx,"clip_one","Clip one vertex");
  node->_vptr_TestNode = (_func_int **)&PTR__TestCase_021693d0;
  node[1]._vptr_TestNode = (_func_int **)pCVar2;
  node_00 = (TestNode *)operator_new(0x78);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,pCVar2->m_testCtx,"clip_two","Clip two vertices");
  node_00->_vptr_TestNode = (_func_int **)&PTR__TestCase_021693d0;
  node_00[1]._vptr_TestNode = (_func_int **)pCVar2;
  node_01 = (TestNode *)operator_new(0x78);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_01,pCVar2->m_testCtx,"clip_three","Clip three vertices");
  node_01->_vptr_TestNode = (_func_int **)&PTR__TestCase_021693d0;
  node_01[1]._vptr_TestNode = (_func_int **)pCVar2;
  tcu::TestNode::addChild((TestNode *)this,node);
  local_1b8 = node_00;
  tcu::TestNode::addChild((TestNode *)this,node_00);
  local_228 = this;
  local_180 = node_01;
  tcu::TestNode::addChild((TestNode *)this,node_01);
  lVar20 = 0;
  do {
    fVar22 = deRandom_getFloat(&local_178);
    fVar23 = deRandom_getFloat(&local_178);
    local_388._0_4_ = fVar23;
    fVar23 = deRandom_getFloat(&local_178);
    local_378._4_4_ = (float)(&iStack_164)[lVar20 * 3];
    local_378._0_4_ = (float)(int)(&local_168)[lVar20 * 3];
    local_378._8_4_ = (float)(int)(&fStack_160)[lVar20 * 3];
    local_448 = (long *)0x0;
    local_440 = local_440 & 0xffffffff00000000;
    lVar6 = 0;
    do {
      *(float *)((long)&local_448 + lVar6 * 4) = *(float *)(local_378 + lVar6 * 4) * 30000.0;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    fVar22 = fVar22 * 15.8 + 0.2;
    fVar24 = local_388._0_4_ * 15.8 + 0.2;
    fVar23 = fVar23 * 15.8 + 0.2;
    local_2d8 = CONCAT44(local_2d8._4_4_,fVar22 * 0.3);
    local_310 = CONCAT44(local_310._4_4_,fVar24 * -0.3);
    local_388 = (float *)CONCAT44(local_388._4_4_,fVar24);
    local_2d0 = CONCAT44(local_2d0._4_4_,fVar24 * -0.4);
    local_290 = (float *)CONCAT44(local_290._4_4_,(float)local_448 * fVar23);
    local_318 = (float *)CONCAT44(local_318._4_4_,local_448._4_4_ * fVar23);
    local_2c8 = (long *)CONCAT44(local_2c8._4_4_,fVar23);
    local_380 = (float *)CONCAT44(local_380._4_4_,(float)local_440 * fVar23);
    local_3e8 = &local_3d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"clip","");
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_3e8);
    local_408 = &local_3f8;
    plVar14 = plVar7 + 2;
    if ((long *)*plVar7 == plVar14) {
      lStack_3f0 = plVar7[3];
      local_3f8 = *plVar14;
    }
    else {
      local_408 = (long *)*plVar7;
      local_3f8 = *plVar14;
    }
    local_400 = plVar7[1];
    *plVar7 = (long)plVar14;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_408);
    local_378._0_8_ = &local_368;
    ppuVar15 = (undefined1 **)(plVar7 + 2);
    if ((undefined1 **)*plVar7 == ppuVar15) {
      local_368 = *ppuVar15;
      puStack_360 = (undefined1 *)plVar7[3];
    }
    else {
      local_378._0_8_ = (undefined1 **)*plVar7;
      local_368 = *ppuVar15;
    }
    local_378._8_8_ = plVar7[1];
    *plVar7 = (long)ppuVar15;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)local_378);
    local_218._0_8_ = local_218 + 0x10;
    plVar14 = plVar7 + 2;
    if ((long *)*plVar7 == plVar14) {
      local_218._16_8_ = *plVar14;
      puStack_200 = (undefined1 *)plVar7[3];
    }
    else {
      local_218._0_8_ = (long *)*plVar7;
      local_218._16_8_ = *plVar14;
    }
    local_218._8_8_ = plVar7[1];
    *plVar7 = (long)plVar14;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if ((undefined1 **)local_378._0_8_ != &local_368) {
      operator_delete((void *)local_378._0_8_,(ulong)(local_368 + 1));
    }
    if (local_408 != &local_3f8) {
      operator_delete(local_408,local_3f8 + 1);
    }
    if (local_3e8 != &local_3d8) {
      operator_delete(local_3e8,local_3d8 + 1);
    }
    local_378._4_4_ = (float)local_2d8;
    local_378._0_4_ = fVar22 * 0.2;
    local_378._12_4_ = fVar22;
    local_378._8_4_ = fVar22 * 0.0;
    local_368 = &DAT_3f8000003f800000;
    puStack_360 = &DAT_3f8000003f800000;
    local_358[1] = (float)local_2d0;
    local_358[0] = (float)local_310;
    local_358[3] = local_388._0_4_;
    local_358[2] = local_388._0_4_ * 0.0;
    local_348 = &DAT_3f8000003f800000;
    puStack_340 = &DAT_3f8000003f800000;
    local_338[1] = local_318._0_4_;
    local_338[0] = SUB84(local_290,0);
    local_338[3] = local_2c8._0_4_;
    local_338[2] = SUB84(local_380,0);
    local_328 = &DAT_3f8000003f800000;
    puStack_320 = &DAT_3f8000003f800000;
    if (((&local_168)[lVar20 * 3] != 0.0) || ((&iStack_164)[lVar20 * 3] != 0)) {
      pTVar8 = (TriangleCaseBase *)operator_new(0xa0);
      TriangleCaseBase::TriangleCaseBase
                (pTVar8,(local_228->super_TestCaseGroup).m_context,(char *)local_218._0_8_,
                 "clip one vertex",(TriangleData *)local_378,(TriangleData *)&local_318,
                 (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
      (pTVar8->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TriangleCaseBase_021783c8;
      tcu::TestNode::addChild(node,(TestNode *)pTVar8);
    }
    if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
      operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 0x1a);
  local_378._0_4_ = 0.0;
  local_378._4_4_ = -0.7;
  local_378._8_4_ = -0.9;
  local_378._12_4_ = 1.0;
  local_368 = &DAT_3f8000003f800000;
  puStack_360 = &DAT_3f8000003f800000;
  local_358[0] = 0.8;
  local_358[1] = 0.0;
  local_358[2] = -0.7;
  local_358[3] = 1.0;
  local_348 = &DAT_3f8000003f800000;
  puStack_340 = &DAT_3f8000003f800000;
  local_338[0] = -0.9;
  local_338[1] = 0.9;
  local_338[2] = 3.0;
  local_338[3] = 1.0;
  local_328 = &DAT_3f8000003f800000;
  puStack_320 = &DAT_3f8000003f800000;
  local_218._0_8_ = (char *)0xbf33333300000000;
  local_218._8_8_ = 0x3f8000003f666666;
  local_218._16_8_ = &DAT_3f8000003f800000;
  puStack_200 = &DAT_3f8000003f800000;
  local_1f8[0] = 0.4;
  local_1f8[1] = 0.0;
  local_1f8[2] = 0.7;
  local_1f8[3] = 1.0;
  local_1e8 = &DAT_3f8000003f800000;
  puStack_1e0 = &DAT_3f8000003f800000;
  local_1d8[0] = -0.9;
  local_1d8[1] = 0.9;
  local_1d8[2] = -3.0;
  local_1d8[3] = 1.0;
  local_1c8 = &DAT_3f8000003f800000;
  puStack_1c0 = &DAT_3f8000003f800000;
  pTVar8 = (TriangleCaseBase *)operator_new(0xa0);
  pPVar4 = local_228;
  TriangleCaseBase::TriangleCaseBase
            (pTVar8,(local_228->super_TestCaseGroup).m_context,"clip_pos_z","clip one vertex",
             (TriangleData *)local_378,(TriangleData *)&local_318,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  (pTVar8->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_021783c8;
  tcu::TestNode::addChild(node,(TestNode *)pTVar8);
  pTVar8 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar8,(pPVar4->super_TestCaseGroup).m_context,"clip_neg_z","clip one vertex",
             (TriangleData *)local_218,(TriangleData *)&local_1b8,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  (pTVar8->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_021783c8;
  tcu::TestNode::addChild(node,(TestNode *)pTVar8);
  local_2a0 = 1;
  local_380 = (float *)0x19;
  local_298 = 0;
  do {
    if (local_298 < 0x19) {
      local_220 = local_298 * 0xc;
      local_388 = &local_168 + local_298 * 3;
      local_1b0 = auStack_15c + local_220;
      local_2c8 = (long *)local_2a0;
      lVar20 = 0;
      do {
        fVar22 = deRandom_getFloat(&local_178);
        fVar23 = deRandom_getFloat(&local_178);
        local_318 = (float *)CONCAT44(local_318._4_4_,fVar23);
        fVar23 = deRandom_getFloat(&local_178);
        local_2d0 = CONCAT44(local_2d0._4_4_,fVar23);
        local_290 = (float *)(long)*(int *)((long)&local_168 + local_220);
        iVar11 = *(int *)((long)&iStack_164 + local_220);
        local_310 = (long)*(int *)((long)&fStack_160 + local_220);
        iVar12 = *(int *)(local_1b0 + lVar20 * 0xc);
        iVar18 = *(int *)(local_1b0 + lVar20 * 0xc + 4);
        iVar1 = *(int *)(local_1b0 + lVar20 * 0xc + 8);
        fVar22 = fVar22 * 15.8 + 0.2;
        local_2d8 = CONCAT44(local_2d8._4_4_,fVar22 * 0.3);
        local_3a8 = &local_398;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"clip","");
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_3a8);
        local_428 = &local_418;
        plVar14 = plVar7 + 2;
        if ((long *)*plVar7 == plVar14) {
          local_418 = *plVar14;
          lStack_410 = plVar7[3];
        }
        else {
          local_418 = *plVar14;
          local_428 = (long *)*plVar7;
        }
        uStack_420 = plVar7[1];
        *plVar7 = (long)plVar14;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_428);
        local_3c8 = &local_3b8;
        plVar14 = plVar7 + 2;
        if ((long *)*plVar7 == plVar14) {
          local_3b8 = *plVar14;
          lStack_3b0 = plVar7[3];
        }
        else {
          local_3b8 = *plVar14;
          local_3c8 = (long *)*plVar7;
        }
        local_3c0 = plVar7[1];
        *plVar7 = (long)plVar14;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_3c8);
        local_448 = &local_438;
        plVar14 = plVar7 + 2;
        if ((long *)*plVar7 == plVar14) {
          local_438 = *plVar14;
          lStack_430 = plVar7[3];
        }
        else {
          local_438 = *plVar14;
          local_448 = (long *)*plVar7;
        }
        local_440 = plVar7[1];
        *plVar7 = (long)plVar14;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_448);
        local_3e8 = &local_3d8;
        plVar14 = plVar7 + 2;
        if ((long *)*plVar7 == plVar14) {
          lStack_3d0 = plVar7[3];
          local_3d8 = *plVar14;
        }
        else {
          local_3e8 = (long *)*plVar7;
          local_3d8 = *plVar14;
        }
        local_3e0 = plVar7[1];
        *plVar7 = (long)plVar14;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_3e8);
        local_408 = &local_3f8;
        plVar14 = plVar7 + 2;
        if ((long *)*plVar7 == plVar14) {
          lStack_3f0 = plVar7[3];
          local_3f8 = *plVar14;
        }
        else {
          local_408 = (long *)*plVar7;
          local_3f8 = *plVar14;
        }
        local_400 = plVar7[1];
        *plVar7 = (long)plVar14;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_408);
        local_378._0_8_ = &local_368;
        ppuVar15 = (undefined1 **)(plVar7 + 2);
        if ((undefined1 **)*plVar7 == ppuVar15) {
          local_368 = *ppuVar15;
          puStack_360 = (undefined1 *)plVar7[3];
        }
        else {
          local_378._0_8_ = (undefined1 **)*plVar7;
          local_368 = *ppuVar15;
        }
        local_378._8_8_ = plVar7[1];
        *plVar7 = (long)ppuVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        puVar9 = (undefined8 *)std::__cxx11::string::append(local_378);
        local_218._0_8_ = local_218 + 0x10;
        pcVar16 = (char *)(puVar9 + 2);
        if ((char *)*puVar9 == pcVar16) {
          local_218._16_8_ = *(undefined8 *)pcVar16;
          puStack_200 = (undefined1 *)puVar9[3];
        }
        else {
          local_218._0_8_ = (char *)*puVar9;
          local_218._16_8_ = *(undefined8 *)pcVar16;
        }
        local_218._8_8_ = puVar9[1];
        *puVar9 = pcVar16;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        if ((undefined1 **)local_378._0_8_ != &local_368) {
          operator_delete((void *)local_378._0_8_,(ulong)(local_368 + 1));
        }
        if (local_408 != &local_3f8) {
          operator_delete(local_408,local_3f8 + 1);
        }
        if (local_3e8 != &local_3d8) {
          operator_delete(local_3e8,local_3d8 + 1);
        }
        if (local_448 != &local_438) {
          operator_delete(local_448,local_438 + 1);
        }
        if (local_3c8 != &local_3b8) {
          operator_delete(local_3c8,local_3b8 + 1);
        }
        if (local_428 != &local_418) {
          operator_delete(local_428,local_418 + 1);
        }
        if (local_3a8 != &local_398) {
          operator_delete(local_3a8,local_398 + 1);
        }
        local_358[3] = local_318._0_4_ * 15.8 + 0.2;
        local_378._4_4_ = (float)local_2d8;
        local_378._0_4_ = fVar22 * 0.2;
        local_378._12_4_ = fVar22;
        local_378._8_4_ = fVar22 * 0.0;
        local_368 = &DAT_3f8000003f800000;
        puStack_360 = &DAT_3f8000003f800000;
        local_358[1] = (float)iVar11 * 30000.0 * local_358[3];
        local_358[0] = (float)(int)local_290 * 30000.0 * local_358[3];
        local_338[3] = (float)local_2d0 * 15.8 + 0.2;
        local_358[2] = (float)(int)local_310 * 30000.0 * local_358[3];
        local_348 = &DAT_3f8000003f800000;
        puStack_340 = &DAT_3f8000003f800000;
        local_338[1] = (float)iVar18 * 30000.0 * local_338[3];
        local_338[0] = (float)iVar12 * 30000.0 * local_338[3];
        local_338[2] = (float)iVar1 * 30000.0 * local_338[3];
        local_328 = &DAT_3f8000003f800000;
        puStack_320 = &DAT_3f8000003f800000;
        local_408 = (long *)local_290;
        local_400 = (long)iVar11;
        local_3f8 = local_310;
        local_3e8 = (long *)(long)iVar12;
        local_3e0 = (long)iVar18;
        local_3d8 = (long)iVar1;
        local_448 = (long *)0xc;
        local_440 = 0x13;
        local_438 = 0;
        local_398 = 0;
        local_3a8 = (long *)0x0;
        uStack_3a0 = 0;
        lVar6 = 0;
        do {
          (&local_3a8)[lVar6] = (&local_408)[lVar6] << 10;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
        local_428 = (long *)0x0;
        uStack_420 = 0;
        local_418 = 0;
        lVar6 = 0;
        do {
          (&local_428)[lVar6] = (&local_3a8)[lVar6] - (&local_448)[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
        local_288 = (long *)0x0;
        lStack_280 = 0;
        local_278 = 0;
        lVar6 = 0;
        do {
          (&local_288)[lVar6] = (long *)((&local_3e8)[lVar6] << 10);
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
        local_2f8 = (long *)0x0;
        uStack_2f0 = 0;
        local_2e8 = 0;
        lVar6 = 0;
        do {
          (&local_2f8)[lVar6] = (long *)((long)(&local_288)[lVar6] - (&local_448)[lVar6]);
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
        local_3b8 = (long)local_428 * uStack_2f0 - (long)local_2f8 * uStack_420;
        local_3c8 = (long *)(local_2e8 * uStack_420 - local_418 * uStack_2f0);
        local_3c0 = local_418 * (long)local_2f8 - local_2e8 * (long)local_428;
        lVar6 = 0;
        lVar17 = 0;
        do {
          lVar17 = lVar17 + (&local_3c8)[lVar6] * (&local_3c8)[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
        lVar17 = SUB168(SEXT816(lVar17) * SEXT816(0x5c28f5c28f5c28f5),8) - lVar17;
        if (-1 < ((lVar17 >> 6) - (lVar17 >> 0x3f)) + local_3b8 * local_3b8) {
          pTVar8 = (TriangleCaseBase *)operator_new(0xa0);
          TriangleCaseBase::TriangleCaseBase
                    (pTVar8,(local_228->super_TestCaseGroup).m_context,(char *)local_218._0_8_,
                     "clip two vertices",(TriangleData *)local_378,(TriangleData *)&local_318,
                     (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
          (pTVar8->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
               = (_func_int **)&PTR__TriangleCaseBase_021783c8;
          tcu::TestNode::addChild(local_1b8,(TestNode *)pTVar8);
        }
        if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
          operator_delete((void *)local_218._0_8_,(ulong)(local_218._16_8_ + 1));
        }
        local_2c8 = (long *)((long)local_2c8 + 1);
        lVar20 = lVar20 + 1;
      } while ((float *)lVar20 != local_380);
    }
    local_298 = local_298 + 1;
    local_2a0 = local_2a0 + 1;
    local_380 = (float *)((long)local_380 + -1);
  } while (local_298 != 0x1a);
  local_2a0 = 2;
  local_1a8 = 1;
  local_220 = 0x19;
  local_298 = 0;
  do {
    if (local_298 < 0x19) {
      local_290 = &local_168 + local_298 * 3;
      local_380 = &local_168 + local_298 * 3;
      local_1b8 = (TestNode *)(auStack_15c + local_298 * 0xc);
      local_1b0 = (undefined1 *)((long)&uStack_150 + local_298 * 0xc);
      local_2d8 = local_2a0;
      local_310 = 0;
      local_2d0 = local_1a8;
      do {
        if (local_2d0 < 0x19) {
          local_2c8 = (long *)((long)local_1b8 + local_310 * 0xc);
          local_318 = &local_168 + local_2d0 * 3;
          lVar6 = local_310 * 0xc + (long)local_1b0;
          lVar20 = 0;
          uVar19 = local_2d8;
          do {
            fVar22 = deRandom_getFloat(&local_178);
            fVar23 = deRandom_getFloat(&local_178);
            local_388 = (float *)CONCAT44(local_388._4_4_,fVar23);
            fVar23 = deRandom_getFloat(&local_178);
            local_300 = local_290[2];
            plVar7 = *(long **)local_290;
            local_308 = plVar7;
            plVar7 = local_308;
            fVar26 = local_388._0_4_ * 15.8 + 0.2;
            lVar17 = local_2c8[1];
            local_2a8 = (int)lVar17;
            plVar14 = (long *)*local_2c8;
            local_2b0 = plVar14;
            plVar14 = local_2b0;
            fVar27 = fVar22 * 15.8 + 0.2;
            plVar3 = *(long **)(lVar6 + lVar20 * 0xc);
            local_2c0 = plVar3;
            plVar3 = local_2c0;
            local_2b8 = *(int *)(lVar6 + 8 + lVar20 * 0xc);
            fVar22 = fVar23 * 15.8 + 0.2;
            local_308._4_4_ = (float)((ulong)plVar7 >> 0x20);
            fVar23 = (float)(int)local_308._4_4_;
            local_2b0._4_4_ = (int)((ulong)plVar14 >> 0x20);
            fVar24 = (float)local_2b0._4_4_;
            local_2c0._4_4_ = (float)((ulong)plVar3 >> 0x20);
            fVar25 = (float)(int)local_2c0._4_4_;
            local_448 = plVar7;
            local_3c8 = plVar14;
            local_428 = plVar3;
            local_378._0_4_ = 0.0;
            local_378._4_4_ = 0.0;
            lVar10 = 0;
            do {
              *(int *)(local_378 + lVar10 * 4) =
                   *(int *)((long)&local_3c8 + lVar10 * 4) - *(int *)((long)&local_448 + lVar10 * 4)
              ;
              lVar10 = lVar10 + 1;
            } while (lVar10 == 1);
            local_218._0_8_ = (char *)0x0;
            lVar10 = 0;
            do {
              *(int *)(local_218 + lVar10 * 4) =
                   *(int *)((long)&local_428 + lVar10 * 4) - *(int *)((long)&local_448 + lVar10 * 4)
              ;
              lVar10 = lVar10 + 1;
            } while (lVar10 == 1);
            local_408 = (long *)0x0;
            lVar10 = 0;
            do {
              *(int *)((long)&local_408 + lVar10 * 4) =
                   *(int *)((long)&local_428 + lVar10 * 4) - *(int *)((long)&local_448 + lVar10 * 4)
              ;
              lVar10 = lVar10 + 1;
            } while (lVar10 == 1);
            local_3e8 = (long *)0x0;
            lVar10 = 0;
            do {
              *(int *)((long)&local_3e8 + lVar10 * 4) =
                   *(int *)((long)&local_3c8 + lVar10 * 4) - *(int *)((long)&local_448 + lVar10 * 4)
              ;
              lVar10 = lVar10 + 1;
            } while (lVar10 == 1);
            local_308 = plVar7;
            local_2c0 = plVar3;
            local_2b0 = plVar14;
            if (local_218._4_4_ * local_378._0_4_ != (int)local_408 * local_3e8._4_4_) {
              local_2f8 = (long *)0x0;
              uStack_2f0 = uStack_2f0 & 0xffffffff00000000;
              local_218._8_8_ = local_218._8_8_ & 0xffffffff00000000;
              local_218._0_4_ = 0.0;
              local_218._4_4_ = 0.0;
              lVar10 = 0;
              do {
                *(int *)(local_218 + lVar10 * 4) =
                     *(int *)((long)&local_2b0 + lVar10 * 4) -
                     *(int *)((long)&local_308 + lVar10 * 4);
                lVar10 = lVar10 + 1;
              } while (lVar10 != 3);
              local_400 = local_400 & 0xffffffff00000000;
              local_408 = (long *)0x0;
              lVar10 = 0;
              do {
                *(int *)((long)&local_408 + lVar10 * 4) =
                     *(int *)((long)&local_2c0 + lVar10 * 4) -
                     *(int *)((long)&local_308 + lVar10 * 4);
                lVar10 = lVar10 + 1;
              } while (lVar10 != 3);
              local_378._4_4_ = local_218._8_4_ * (int)local_408 - (int)local_400 * local_218._0_4_;
              local_378._0_4_ = (int)local_400 * local_218._4_4_ - local_218._8_4_ * local_408._4_4_
              ;
              local_378._8_4_ = local_218._0_4_ * local_408._4_4_ - (int)local_408 * local_218._4_4_
              ;
              local_218._8_8_ = local_218._8_8_ & 0xffffffff00000000;
              local_218._0_8_ = (char *)0x0;
              lVar10 = 0;
              do {
                *(int *)(local_218 + lVar10 * 4) =
                     *(int *)((long)&local_2f8 + lVar10 * 4) -
                     *(int *)((long)&local_308 + lVar10 * 4);
                lVar10 = lVar10 + 1;
              } while (lVar10 != 3);
              lVar10 = 0;
              iVar11 = 0;
              do {
                iVar11 = iVar11 + *(int *)(local_218 + lVar10 * 4) *
                                  *(int *)(local_378 + lVar10 * 4);
                lVar10 = lVar10 + 1;
              } while (lVar10 != 3);
              if (iVar11 == 0) {
                local_3e0 = local_3e0 & 0xffffffff00000000;
                local_3e8 = (long *)0x0;
                lVar10 = 0;
                do {
                  *(int *)((long)&local_3e8 + lVar10 * 4) =
                       *(int *)((long)&local_2b0 + lVar10 * 4) -
                       *(int *)((long)&local_308 + lVar10 * 4);
                  lVar10 = lVar10 + 1;
                } while (lVar10 != 3);
                local_440 = local_440 & 0xffffffff00000000;
                local_448 = (long *)0x0;
                lVar10 = 0;
                do {
                  *(int *)((long)&local_448 + lVar10 * 4) =
                       *(int *)((long)&local_2f8 + lVar10 * 4) -
                       *(int *)((long)&local_308 + lVar10 * 4);
                  lVar10 = lVar10 + 1;
                } while (lVar10 != 3);
                local_408 = (long *)CONCAT44((int)local_3e0 * (int)(float)local_448 -
                                             (int)(float)local_440 * (int)local_3e8,
                                             (int)(float)local_440 * local_3e8._4_4_ -
                                             (int)local_3e0 * (int)local_448._4_4_);
                local_400 = CONCAT44(local_400._4_4_,
                                     (int)local_3e8 * (int)local_448._4_4_ -
                                     (int)(float)local_448 * local_3e8._4_4_);
                lVar10 = 0;
                iVar11 = 0;
                do {
                  iVar11 = iVar11 + *(int *)((long)&local_408 + lVar10 * 4) *
                                    *(int *)(local_378 + lVar10 * 4);
                  lVar10 = lVar10 + 1;
                } while (lVar10 != 3);
                uStack_420 = uStack_420 & 0xffffffff00000000;
                local_428 = (long *)0x0;
                lVar10 = 0;
                do {
                  *(int *)((long)&local_428 + lVar10 * 4) =
                       *(int *)((long)&local_2c0 + lVar10 * 4) -
                       *(int *)((long)&local_308 + lVar10 * 4);
                  lVar10 = lVar10 + 1;
                } while (lVar10 != 3);
                uStack_3a0 = uStack_3a0 & 0xffffffff00000000;
                local_3a8 = (long *)0x0;
                lVar10 = 0;
                do {
                  *(int *)((long)&local_3a8 + lVar10 * 4) =
                       *(int *)((long)&local_2f8 + lVar10 * 4) -
                       *(int *)((long)&local_308 + lVar10 * 4);
                  lVar10 = lVar10 + 1;
                } while (lVar10 != 3);
                local_3c8 = (long *)CONCAT44((int)uStack_420 * (int)local_3a8 -
                                             (int)uStack_3a0 * (int)local_428,
                                             (int)uStack_3a0 * local_428._4_4_ -
                                             (int)uStack_420 * local_3a8._4_4_);
                local_3c0 = CONCAT44(local_3c0._4_4_,
                                     (int)local_428 * local_3a8._4_4_ -
                                     (int)local_3a8 * local_428._4_4_);
                lVar10 = 0;
                iVar12 = 0;
                do {
                  iVar12 = iVar12 + *(int *)((long)&local_3c8 + lVar10 * 4) *
                                    *(int *)(local_378 + lVar10 * 4);
                  lVar10 = lVar10 + 1;
                } while (lVar10 != 3);
                iVar18 = iVar11 >> 0x1f;
                if (0 < iVar11) {
                  iVar18 = 1;
                }
                iVar11 = iVar12 >> 0x1f;
                if (0 < iVar12) {
                  iVar11 = 1;
                }
                if (iVar18 != iVar11) {
                  local_3e0 = local_3e0 & 0xffffffff00000000;
                  local_3e8 = (long *)0x0;
                  lVar10 = 0;
                  do {
                    *(int *)((long)&local_3e8 + lVar10 * 4) =
                         *(int *)((long)&local_2c0 + lVar10 * 4) -
                         *(int *)((long)&local_2b0 + lVar10 * 4);
                    lVar10 = lVar10 + 1;
                  } while (lVar10 != 3);
                  local_440 = local_440 & 0xffffffff00000000;
                  local_448 = (long *)0x0;
                  lVar10 = 0;
                  do {
                    *(int *)((long)&local_448 + lVar10 * 4) =
                         *(int *)((long)&local_2f8 + lVar10 * 4) -
                         *(int *)((long)&local_2b0 + lVar10 * 4);
                    lVar10 = lVar10 + 1;
                  } while (lVar10 != 3);
                  local_408 = (long *)CONCAT44((int)local_3e0 * (int)(float)local_448 -
                                               (int)(float)local_440 * (int)local_3e8,
                                               (int)(float)local_440 * local_3e8._4_4_ -
                                               (int)local_3e0 * (int)local_448._4_4_);
                  local_400 = CONCAT44(local_400._4_4_,
                                       (int)local_3e8 * (int)local_448._4_4_ -
                                       (int)(float)local_448 * local_3e8._4_4_);
                  lVar10 = 0;
                  iVar11 = 0;
                  do {
                    iVar11 = iVar11 + *(int *)((long)&local_408 + lVar10 * 4) *
                                      *(int *)(local_378 + lVar10 * 4);
                    lVar10 = lVar10 + 1;
                  } while (lVar10 != 3);
                  uStack_420 = uStack_420 & 0xffffffff00000000;
                  local_428 = (long *)0x0;
                  lVar10 = 0;
                  do {
                    *(int *)((long)&local_428 + lVar10 * 4) =
                         *(int *)((long)&local_308 + lVar10 * 4) -
                         *(int *)((long)&local_2b0 + lVar10 * 4);
                    lVar10 = lVar10 + 1;
                  } while (lVar10 != 3);
                  uStack_3a0 = uStack_3a0 & 0xffffffff00000000;
                  local_3a8 = (long *)0x0;
                  lVar10 = 0;
                  do {
                    *(int *)((long)&local_3a8 + lVar10 * 4) =
                         *(int *)((long)&local_2f8 + lVar10 * 4) -
                         *(int *)((long)&local_2b0 + lVar10 * 4);
                    lVar10 = lVar10 + 1;
                  } while (lVar10 != 3);
                  local_3c8 = (long *)CONCAT44((int)uStack_420 * (int)local_3a8 -
                                               (int)uStack_3a0 * (int)local_428,
                                               (int)uStack_3a0 * local_428._4_4_ -
                                               (int)uStack_420 * local_3a8._4_4_);
                  local_3c0 = CONCAT44(local_3c0._4_4_,
                                       (int)local_428 * local_3a8._4_4_ -
                                       (int)local_3a8 * local_428._4_4_);
                  lVar10 = 0;
                  iVar12 = 0;
                  do {
                    iVar12 = iVar12 + *(int *)((long)&local_3c8 + lVar10 * 4) *
                                      *(int *)(local_378 + lVar10 * 4);
                    lVar10 = lVar10 + 1;
                  } while (lVar10 != 3);
                  iVar18 = iVar11 >> 0x1f;
                  if (0 < iVar11) {
                    iVar18 = 1;
                  }
                  iVar11 = iVar12 >> 0x1f;
                  if (0 < iVar12) {
                    iVar11 = 1;
                  }
                  if (iVar18 != iVar11) {
                    local_3e0 = local_3e0 & 0xffffffff00000000;
                    local_3e8 = (long *)0x0;
                    lVar10 = 0;
                    do {
                      *(int *)((long)&local_3e8 + lVar10 * 4) =
                           *(int *)((long)&local_308 + lVar10 * 4) -
                           *(int *)((long)&local_2c0 + lVar10 * 4);
                      lVar10 = lVar10 + 1;
                    } while (lVar10 != 3);
                    local_440 = local_440 & 0xffffffff00000000;
                    local_448 = (long *)0x0;
                    lVar10 = 0;
                    do {
                      *(int *)((long)&local_448 + lVar10 * 4) =
                           *(int *)((long)&local_2f8 + lVar10 * 4) -
                           *(int *)((long)&local_2c0 + lVar10 * 4);
                      lVar10 = lVar10 + 1;
                    } while (lVar10 != 3);
                    local_408 = (long *)CONCAT44((int)local_3e0 * (int)(float)local_448 -
                                                 (int)(float)local_440 * (int)local_3e8,
                                                 (int)(float)local_440 * local_3e8._4_4_ -
                                                 (int)local_3e0 * (int)local_448._4_4_);
                    local_400 = CONCAT44(local_400._4_4_,
                                         (int)local_3e8 * (int)local_448._4_4_ -
                                         (int)(float)local_448 * local_3e8._4_4_);
                    lVar10 = 0;
                    uVar5 = 0;
                    do {
                      uVar5 = uVar5 + *(int *)((long)&local_408 + lVar10 * 4) *
                                      *(int *)(local_378 + lVar10 * 4);
                      lVar10 = lVar10 + 1;
                    } while (lVar10 != 3);
                    uStack_420 = uStack_420 & 0xffffffff00000000;
                    local_428 = (long *)0x0;
                    lVar10 = 0;
                    do {
                      *(int *)((long)&local_428 + lVar10 * 4) =
                           *(int *)((long)&local_2b0 + lVar10 * 4) -
                           *(int *)((long)&local_2c0 + lVar10 * 4);
                      lVar10 = lVar10 + 1;
                    } while (lVar10 != 3);
                    uStack_3a0 = uStack_3a0 & 0xffffffff00000000;
                    local_3a8 = (long *)0x0;
                    lVar10 = 0;
                    do {
                      *(int *)((long)&local_3a8 + lVar10 * 4) =
                           *(int *)((long)&local_2f8 + lVar10 * 4) -
                           *(int *)((long)&local_2c0 + lVar10 * 4);
                      lVar10 = lVar10 + 1;
                    } while (lVar10 != 3);
                    local_3c8 = (long *)CONCAT44((int)uStack_420 * (int)local_3a8 -
                                                 (int)uStack_3a0 * (int)local_428,
                                                 (int)uStack_3a0 * local_428._4_4_ -
                                                 (int)uStack_420 * local_3a8._4_4_);
                    local_3c0 = CONCAT44(local_3c0._4_4_,
                                         (int)local_428 * local_3a8._4_4_ -
                                         (int)local_3a8 * local_428._4_4_);
                    lVar10 = 0;
                    uVar13 = 0;
                    do {
                      uVar13 = uVar13 + *(int *)((long)&local_3c8 + lVar10 * 4) *
                                        *(int *)(local_378 + lVar10 * 4);
                      lVar10 = lVar10 + 1;
                    } while (lVar10 != 3);
                    bVar21 = (int)uVar13 < 1;
                    if ((int)uVar5 < 1) {
                      bVar21 = (int)(uVar13 ^ uVar5) < 0 || 0 < (int)uVar13;
                    }
                    if (bVar21) {
                      local_378._4_4_ = fVar23 * 20000.0 * fVar27;
                      local_378._0_4_ = (float)(int)plVar7 * 20000.0 * fVar27;
                      local_378._12_4_ = fVar27;
                      local_378._8_4_ = (float)(int)local_300 * 20000.0 * fVar27;
                      local_368 = &DAT_3f8000003f800000;
                      puStack_360 = &DAT_3f8000003f800000;
                      local_358[1] = fVar24 * 20000.0 * fVar26;
                      local_358[0] = (float)(int)plVar14 * 20000.0 * fVar26;
                      local_358[3] = fVar26;
                      local_358[2] = (float)(int)lVar17 * 20000.0 * fVar26;
                      local_348 = &DAT_3f8000003f800000;
                      puStack_340 = &DAT_3f8000003f800000;
                      local_338[1] = fVar25 * 20000.0 * fVar22;
                      local_338[0] = (float)(int)plVar3 * 20000.0 * fVar22;
                      local_338[3] = fVar22;
                      local_338[2] = (float)local_2b8 * 20000.0 * fVar22;
                      local_328 = &DAT_3f8000003f800000;
                      puStack_320 = &DAT_3f8000003f800000;
                      local_1a0[0] = local_190;
                      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"clip","")
                      ;
                      plVar7 = (long *)std::__cxx11::string::append((char *)local_1a0);
                      local_268 = &local_258;
                      plVar14 = plVar7 + 2;
                      if ((long *)*plVar7 == plVar14) {
                        local_258 = *plVar14;
                        lStack_250 = plVar7[3];
                      }
                      else {
                        local_258 = *plVar14;
                        local_268 = (long *)*plVar7;
                      }
                      local_260 = plVar7[1];
                      *plVar7 = (long)plVar14;
                      plVar7[1] = 0;
                      *(undefined1 *)(plVar7 + 2) = 0;
                      plVar7 = (long *)std::__cxx11::string::append((char *)&local_268);
                      local_248 = &local_238;
                      plVar14 = plVar7 + 2;
                      if ((long *)*plVar7 == plVar14) {
                        local_238 = *plVar14;
                        lStack_230 = plVar7[3];
                      }
                      else {
                        local_238 = *plVar14;
                        local_248 = (long *)*plVar7;
                      }
                      local_240 = plVar7[1];
                      *plVar7 = (long)plVar14;
                      plVar7[1] = 0;
                      *(undefined1 *)(plVar7 + 2) = 0;
                      plVar7 = (long *)std::__cxx11::string::append((char *)&local_248);
                      local_288 = &local_278;
                      plVar14 = plVar7 + 2;
                      if ((long *)*plVar7 == plVar14) {
                        local_278 = *plVar14;
                        lStack_270 = plVar7[3];
                      }
                      else {
                        local_278 = *plVar14;
                        local_288 = (long *)*plVar7;
                      }
                      lStack_280 = plVar7[1];
                      *plVar7 = (long)plVar14;
                      plVar7[1] = 0;
                      *(undefined1 *)(plVar7 + 2) = 0;
                      plVar7 = (long *)std::__cxx11::string::append((char *)&local_288);
                      local_2f8 = &local_2e8;
                      plVar14 = plVar7 + 2;
                      if ((long *)*plVar7 == plVar14) {
                        local_2e8 = *plVar14;
                        lStack_2e0 = plVar7[3];
                      }
                      else {
                        local_2e8 = *plVar14;
                        local_2f8 = (long *)*plVar7;
                      }
                      uStack_2f0 = plVar7[1];
                      *plVar7 = (long)plVar14;
                      plVar7[1] = 0;
                      *(undefined1 *)(plVar7 + 2) = 0;
                      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2f8);
                      local_3a8 = &local_398;
                      plVar14 = plVar7 + 2;
                      if ((long *)*plVar7 == plVar14) {
                        local_398 = *plVar14;
                        lStack_390 = plVar7[3];
                      }
                      else {
                        local_398 = *plVar14;
                        local_3a8 = (long *)*plVar7;
                      }
                      uStack_3a0 = plVar7[1];
                      *plVar7 = (long)plVar14;
                      plVar7[1] = 0;
                      *(undefined1 *)(plVar7 + 2) = 0;
                      plVar7 = (long *)std::__cxx11::string::append((char *)&local_3a8);
                      local_428 = &local_418;
                      plVar14 = plVar7 + 2;
                      if ((long *)*plVar7 == plVar14) {
                        local_418 = *plVar14;
                        lStack_410 = plVar7[3];
                      }
                      else {
                        local_418 = *plVar14;
                        local_428 = (long *)*plVar7;
                      }
                      uStack_420 = plVar7[1];
                      *plVar7 = (long)plVar14;
                      plVar7[1] = 0;
                      *(undefined1 *)(plVar7 + 2) = 0;
                      plVar7 = (long *)std::__cxx11::string::append((char *)&local_428);
                      local_3c8 = &local_3b8;
                      plVar14 = plVar7 + 2;
                      if ((long *)*plVar7 == plVar14) {
                        local_3b8 = *plVar14;
                        lStack_3b0 = plVar7[3];
                      }
                      else {
                        local_3b8 = *plVar14;
                        local_3c8 = (long *)*plVar7;
                      }
                      local_3c0 = plVar7[1];
                      *plVar7 = (long)plVar14;
                      plVar7[1] = 0;
                      *(undefined1 *)(plVar7 + 2) = 0;
                      plVar7 = (long *)std::__cxx11::string::append((char *)&local_3c8);
                      local_448 = &local_438;
                      plVar14 = plVar7 + 2;
                      if ((long *)*plVar7 == plVar14) {
                        lStack_430 = plVar7[3];
                        local_438 = *plVar14;
                      }
                      else {
                        local_448 = (long *)*plVar7;
                        local_438 = *plVar14;
                      }
                      local_440 = plVar7[1];
                      *plVar7 = (long)plVar14;
                      plVar7[1] = 0;
                      *(undefined1 *)(plVar7 + 2) = 0;
                      plVar7 = (long *)std::__cxx11::string::append((char *)&local_448);
                      local_3e8 = &local_3d8;
                      plVar14 = plVar7 + 2;
                      if ((long *)*plVar7 == plVar14) {
                        lStack_3d0 = plVar7[3];
                        local_3d8 = *plVar14;
                      }
                      else {
                        local_3e8 = (long *)*plVar7;
                        local_3d8 = *plVar14;
                      }
                      local_3e0 = plVar7[1];
                      *plVar7 = (long)plVar14;
                      plVar7[1] = 0;
                      *(undefined1 *)(plVar7 + 2) = 0;
                      plVar7 = (long *)std::__cxx11::string::append((char *)&local_3e8);
                      local_408 = &local_3f8;
                      plVar14 = plVar7 + 2;
                      if ((long *)*plVar7 == plVar14) {
                        lStack_3f0 = plVar7[3];
                        local_3f8 = *plVar14;
                      }
                      else {
                        local_408 = (long *)*plVar7;
                        local_3f8 = *plVar14;
                      }
                      local_400 = plVar7[1];
                      *plVar7 = (long)plVar14;
                      plVar7[1] = 0;
                      *(undefined1 *)(plVar7 + 2) = 0;
                      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_408);
                      local_218._0_8_ = local_218 + 0x10;
                      pcVar16 = (char *)(puVar9 + 2);
                      if ((char *)*puVar9 == pcVar16) {
                        local_218._16_8_ = *(undefined8 *)pcVar16;
                        puStack_200 = (undefined1 *)puVar9[3];
                      }
                      else {
                        local_218._16_8_ = *(undefined8 *)pcVar16;
                        local_218._0_8_ = (char *)*puVar9;
                      }
                      local_218._8_8_ = puVar9[1];
                      *puVar9 = pcVar16;
                      puVar9[1] = 0;
                      *(undefined1 *)(puVar9 + 2) = 0;
                      if (local_408 != &local_3f8) {
                        operator_delete(local_408,local_3f8 + 1);
                      }
                      if (local_3e8 != &local_3d8) {
                        operator_delete(local_3e8,local_3d8 + 1);
                      }
                      if (local_448 != &local_438) {
                        operator_delete(local_448,local_438 + 1);
                      }
                      if (local_3c8 != &local_3b8) {
                        operator_delete(local_3c8,local_3b8 + 1);
                      }
                      if (local_428 != &local_418) {
                        operator_delete(local_428,local_418 + 1);
                      }
                      if (local_3a8 != &local_398) {
                        operator_delete(local_3a8,local_398 + 1);
                      }
                      if (local_2f8 != &local_2e8) {
                        operator_delete(local_2f8,local_2e8 + 1);
                      }
                      if (local_288 != &local_278) {
                        operator_delete(local_288,local_278 + 1);
                      }
                      if (local_248 != &local_238) {
                        operator_delete(local_248,local_238 + 1);
                      }
                      if (local_268 != &local_258) {
                        operator_delete(local_268,local_258 + 1);
                      }
                      if (local_1a0[0] != local_190) {
                        operator_delete(local_1a0[0],local_190[0] + 1);
                      }
                      pTVar8 = (TriangleCaseBase *)operator_new(0xa0);
                      TriangleCaseBase::TriangleCaseBase
                                (pTVar8,(local_228->super_TestCaseGroup).m_context,
                                 (char *)local_218._0_8_,"clip three vertices",
                                 (TriangleData *)local_378,(TriangleData *)&local_318,
                                 (WindowRectangle *)
                                 Functional::(anonymous_namespace)::VIEWPORT_CENTER);
                      (pTVar8->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode.
                      _vptr_TestNode = (_func_int **)&PTR__TriangleCaseBase_021783c8;
                      tcu::TestNode::addChild(local_180,(TestNode *)pTVar8);
                      if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
                        operator_delete((void *)local_218._0_8_,(ulong)(local_218._16_8_ + 1));
                      }
                    }
                  }
                }
              }
            }
            lVar20 = lVar20 + 1;
            bVar21 = uVar19 < 0x19;
            uVar19 = uVar19 + 1;
          } while (bVar21);
        }
        local_2d0 = local_2d0 + 1;
        local_310 = local_310 + 1;
        local_2d8 = local_2d8 + 1;
      } while (local_310 != local_220);
    }
    local_298 = local_298 + 1;
    local_2a0 = local_2a0 + 1;
    local_1a8 = local_1a8 + 1;
    local_220 = local_220 + -1;
  } while (local_298 != 0x1a);
  return 0x1a;
}

Assistant:

void PolyVertexClipTestGroup::init (void)
{
	const float far					= 30000.0f;
	const float farForThreeVertex	= 20000.0f; // 3 vertex clipping tests use smaller triangles
	const tcu::IVec3 outside[] =
	{
		// outside one clipping plane
		tcu::IVec3(-1,  0,  0),
		tcu::IVec3( 1,  0,  0),
		tcu::IVec3( 0,  1,  0),
		tcu::IVec3( 0, -1,  0),
		tcu::IVec3( 0,  0,  1),
		tcu::IVec3( 0,  0, -1),

		// outside two clipping planes
		tcu::IVec3(-1, -1,  0),
		tcu::IVec3( 1, -1,  0),
		tcu::IVec3( 1,  1,  0),
		tcu::IVec3(-1,  1,  0),

		tcu::IVec3(-1,  0, -1),
		tcu::IVec3( 1,  0, -1),
		tcu::IVec3( 1,  0,  1),
		tcu::IVec3(-1,  0,  1),

		tcu::IVec3( 0, -1, -1),
		tcu::IVec3( 0,  1, -1),
		tcu::IVec3( 0,  1,  1),
		tcu::IVec3( 0, -1,  1),

		// outside three clipping planes
		tcu::IVec3(-1, -1,  1),
		tcu::IVec3( 1, -1,  1),
		tcu::IVec3( 1,  1,  1),
		tcu::IVec3(-1,  1,  1),

		tcu::IVec3(-1, -1, -1),
		tcu::IVec3( 1, -1, -1),
		tcu::IVec3( 1,  1, -1),
		tcu::IVec3(-1,  1, -1),
	};

	de::Random rnd(0xabcdef);

	TestCaseGroup* clipOne		= new TestCaseGroup(m_context, "clip_one",		"Clip one vertex");
	TestCaseGroup* clipTwo		= new TestCaseGroup(m_context, "clip_two",		"Clip two vertices");
	TestCaseGroup* clipThree	= new TestCaseGroup(m_context, "clip_three",	"Clip three vertices");

	addChild(clipOne);
	addChild(clipTwo);
	addChild(clipThree);

	// Test 1 point clipped
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(outside); ++ndx)
	{
		const float		w0		= rnd.getFloat(0.2f, 16.0f);
		const float		w1		= rnd.getFloat(0.2f, 16.0f);
		const float		w2		= rnd.getFloat(0.2f, 16.0f);
		const tcu::Vec4 white	= tcu::Vec4(    1,	    1,	1,	1);
		const tcu::Vec3 r0		= tcu::Vec3( 0.2f,	 0.3f,	0);
		const tcu::Vec3 r1		= tcu::Vec3(-0.3f,	-0.4f,	0);
		const tcu::Vec3 r2		= IVec3ToVec3(outside[ndx]) * far;
		const tcu::Vec4 p0		= tcu::Vec4(r0.x() * w0, r0.y() * w0, r0.z() * w0, w0);
		const tcu::Vec4 p1		= tcu::Vec4(r1.x() * w1, r1.y() * w1, r1.z() * w1, w1);
		const tcu::Vec4 p2		= tcu::Vec4(r2.x() * w2, r2.y() * w2, r2.z() * w2, w2);

		const std::string name	= std::string("clip") +
			(outside[ndx].x() > 0 ? "_pos_x" : (outside[ndx].x() < 0 ? "_neg_x" : "")) +
			(outside[ndx].y() > 0 ? "_pos_y" : (outside[ndx].y() < 0 ? "_neg_y" : "")) +
			(outside[ndx].z() > 0 ? "_pos_z" : (outside[ndx].z() < 0 ? "_neg_z" : ""));

		const TriangleCase::TriangleData triangle =	{p0, white, p1, white, p2, white};

		// don't try to test with degenerate (or almost degenerate) triangles
		if (outside[ndx].x() == 0 && outside[ndx].y() == 0)
			continue;

		clipOne->addChild(new TriangleCase(m_context, name.c_str(), "clip one vertex", &triangle, &triangle + 1, VIEWPORT_CENTER));
	}

	// Special triangles for "clip_z" cases, default triangles is not good, since it has very small visible area => problems with MSAA
	{
		const tcu::Vec4 white = tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f);

		const TriangleCase::TriangleData posZTriangle =
		{
			tcu::Vec4( 0.0f, -0.7f, -0.9f, 1.0f), white,
			tcu::Vec4( 0.8f,  0.0f, -0.7f, 1.0f), white,
			tcu::Vec4(-0.9f,  0.9f,  3.0f, 1.0f), white
		};
		const TriangleCase::TriangleData negZTriangle =
		{
			tcu::Vec4( 0.0f, -0.7f,  0.9f, 1.0f), white,
			tcu::Vec4( 0.4f,  0.0f,  0.7f, 1.0f), white,
			tcu::Vec4(-0.9f,  0.9f, -3.0f, 1.0f), white
		};

		clipOne->addChild(new TriangleCase(m_context, "clip_pos_z", "clip one vertex", &posZTriangle, &posZTriangle + 1, VIEWPORT_CENTER));
		clipOne->addChild(new TriangleCase(m_context, "clip_neg_z", "clip one vertex", &negZTriangle, &negZTriangle + 1, VIEWPORT_CENTER));
	}

	// Test 2 points clipped
	for (int ndx1 = 0; ndx1 < DE_LENGTH_OF_ARRAY(outside); ++ndx1)
	for (int ndx2 = ndx1 + 1; ndx2 < DE_LENGTH_OF_ARRAY(outside); ++ndx2)
	{
		const float		w0		= rnd.getFloat(0.2f, 16.0f);
		const float		w1		= rnd.getFloat(0.2f, 16.0f);
		const float		w2		= rnd.getFloat(0.2f, 16.0f);
		const tcu::Vec4 white	= tcu::Vec4(    1,	    1,	1,	1);
		const tcu::Vec3 r0		= tcu::Vec3( 0.2f,	 0.3f,	0);
		const tcu::IVec3 r1		= outside[ndx1];
		const tcu::IVec3 r2		= outside[ndx2];
		const tcu::Vec4 p0		= tcu::Vec4(r0.x() * w0, r0.y() * w0, r0.z() * w0, w0);
		const tcu::Vec4 p1		= tcu::Vec4(float(r1.x()) * far * w1, float(r1.y()) * far * w1, float(r1.z()) * far * w1, w1);
		const tcu::Vec4 p2		= tcu::Vec4(float(r2.x()) * far * w2, float(r2.y()) * far * w2, float(r2.z()) * far * w2, w2);

		const std::string name	= std::string("clip") +
			(outside[ndx1].x() > 0 ? "_pos_x" : (outside[ndx1].x() < 0 ? "_neg_x" : "")) +
			(outside[ndx1].y() > 0 ? "_pos_y" : (outside[ndx1].y() < 0 ? "_neg_y" : "")) +
			(outside[ndx1].z() > 0 ? "_pos_z" : (outside[ndx1].z() < 0 ? "_neg_z" : "")) +
			"_and" +
			(outside[ndx2].x() > 0 ? "_pos_x" : (outside[ndx2].x() < 0 ? "_neg_x" : "")) +
			(outside[ndx2].y() > 0 ? "_pos_y" : (outside[ndx2].y() < 0 ? "_neg_y" : "")) +
			(outside[ndx2].z() > 0 ? "_pos_z" : (outside[ndx2].z() < 0 ? "_neg_z" : ""));

		const TriangleCase::TriangleData triangle =	{p0, white, p1, white, p2, white};

		if (twoPointClippedTriangleInvisible(r0, r1, r2))
			continue;

		clipTwo->addChild(new TriangleCase(m_context, name.c_str(), "clip two vertices", &triangle, &triangle + 1, VIEWPORT_CENTER));
	}

	// Test 3 points clipped
	for (int ndx1 = 0; ndx1 < DE_LENGTH_OF_ARRAY(outside); ++ndx1)
	for (int ndx2 = ndx1 + 1; ndx2 < DE_LENGTH_OF_ARRAY(outside); ++ndx2)
	for (int ndx3 = ndx2 + 1; ndx3 < DE_LENGTH_OF_ARRAY(outside); ++ndx3)
	{
		const float		w0		= rnd.getFloat(0.2f, 16.0f);
		const float		w1		= rnd.getFloat(0.2f, 16.0f);
		const float		w2		= rnd.getFloat(0.2f, 16.0f);
		const tcu::Vec4 white	= tcu::Vec4(1, 1, 1, 1);
		const tcu::IVec3 r0		= outside[ndx1];
		const tcu::IVec3 r1		= outside[ndx2];
		const tcu::IVec3 r2		= outside[ndx3];
		const tcu::Vec4 p0		= tcu::Vec4(float(r0.x()) * farForThreeVertex * w0, float(r0.y()) * farForThreeVertex * w0, float(r0.z()) * farForThreeVertex * w0, w0);
		const tcu::Vec4 p1		= tcu::Vec4(float(r1.x()) * farForThreeVertex * w1, float(r1.y()) * farForThreeVertex * w1, float(r1.z()) * farForThreeVertex * w1, w1);
		const tcu::Vec4 p2		= tcu::Vec4(float(r2.x()) * farForThreeVertex * w2, float(r2.y()) * farForThreeVertex * w2, float(r2.z()) * farForThreeVertex * w2, w2);

		// ignore cases where polygon is along xz or yz planes
		if (pointsOnLine(r0.swizzle(0, 1), r1.swizzle(0, 1), r2.swizzle(0, 1)))
			continue;

		// triangle is visible only if it intersects the origin
		if (pointOnTriangle(tcu::IVec3(0, 0, 0), r0, r1, r2))
		{
			const TriangleCase::TriangleData triangle =	{p0, white, p1, white, p2, white};
			const std::string name	= std::string("clip") +
				(outside[ndx1].x() > 0 ? "_pos_x" : (outside[ndx1].x() < 0 ? "_neg_x" : "")) +
				(outside[ndx1].y() > 0 ? "_pos_y" : (outside[ndx1].y() < 0 ? "_neg_y" : "")) +
				(outside[ndx1].z() > 0 ? "_pos_z" : (outside[ndx1].z() < 0 ? "_neg_z" : "")) +
				"_and" +
				(outside[ndx2].x() > 0 ? "_pos_x" : (outside[ndx2].x() < 0 ? "_neg_x" : "")) +
				(outside[ndx2].y() > 0 ? "_pos_y" : (outside[ndx2].y() < 0 ? "_neg_y" : "")) +
				(outside[ndx2].z() > 0 ? "_pos_z" : (outside[ndx2].z() < 0 ? "_neg_z" : "")) +
				"_and" +
				(outside[ndx3].x() > 0 ? "_pos_x" : (outside[ndx3].x() < 0 ? "_neg_x" : "")) +
				(outside[ndx3].y() > 0 ? "_pos_y" : (outside[ndx3].y() < 0 ? "_neg_y" : "")) +
				(outside[ndx3].z() > 0 ? "_pos_z" : (outside[ndx3].z() < 0 ? "_neg_z" : ""));

			clipThree->addChild(new TriangleCase(m_context, name.c_str(), "clip three vertices", &triangle, &triangle + 1, VIEWPORT_CENTER));
		}
	}
}